

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

bool __thiscall dg::DGLLVMPointerAnalysis::run(DGLLVMPointerAnalysis *this)

{
  bool bVar1;
  
  if ((this->PTA)._M_t.
      super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
      ._M_t.
      super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
      .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl ==
      (PointerAnalysis *)0x0) {
    initialize(this);
  }
  bVar1 = (bool)dg::pta::PointerAnalysis::run();
  return bVar1;
}

Assistant:

bool run() override {
        if (!PTA) {
            initialize();
        }
        return PTA->run();
    }